

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

int __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::remove(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
         *this,char *__filename)

{
  long *plVar1;
  long lVar2;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *pQVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Node *in_RDX;
  Node *extraout_RDX;
  Node *value;
  array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
  *__range2;
  size_type __n;
  iterator __end0;
  undefined8 unaff_R15;
  Node **value_1;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_00;
  Box<float> local_40;
  
  lVar6._0_4_ = (this->mBox).left;
  lVar6._4_4_ = (this->mBox).top;
  value = in_RDX;
  if (lVar6 != 0) {
    local_40 = *(Box<float> *)
                (in_RDX->children)._M_elems[0]._M_t.
                super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                ._M_t.
                super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                .
                super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ;
    uVar4 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                         *)__filename,&local_40,(Box<float> *)in_RDX);
    value = extraout_RDX;
    if (uVar4 != 0xffffffff) {
      this_00 = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                  **)(&(this->mBox).left + (ulong)uVar4 * 2);
      local_40 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                             *)__filename,(Box<float> *)(ulong)uVar4,(int)extraout_RDX);
      iVar5 = remove(this_00,(char *)&local_40);
      if ((char)iVar5 != '\0') {
        __n = *(long *)&this[1].mBox.width - *(long *)&this[1].mBox >> 3;
        for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
          plVar1 = *(long **)((long)&(this->mBox).left + lVar6);
          if (*plVar1 != 0) {
            return 0;
          }
          __n = __n + (plVar1[5] - plVar1[4] >> 3);
        }
        if (__n < 0x11) {
          std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(this + 1),__n);
          for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
            lVar2 = *(long *)((long)&(this->mBox).left + lVar6);
            pQVar3 = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                       **)(lVar2 + 0x28);
            for (this_00 = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                             **)(lVar2 + 0x20); this_00 != pQVar3;
                this_00 = (Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                           *)&(this_00->mBox).width) {
              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(this + 1),(value_type *)this_00
                        );
            }
          }
          for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
            std::
            __uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
            ::reset((__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                     *)((long)&(this->mBox).left + lVar6),(pointer)0x0);
          }
          return (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
        }
      }
      return 0;
    }
  }
  removeValue(this,in_RDX,(Node **)value);
  return (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),lVar6 == 0);
}

Assistant:

bool remove(Node* node, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Remove the value from node
            removeValue(node, value);
            return true;
        }
        else
        {
            // Remove the value in a child if the value is entirely contained in it
            auto i = getQuadrant(box, mGetBox(value));
            if (i != -1)
            {
                if (remove(node->children[static_cast<std::size_t>(i)].get(), computeBox(box, i), value))
                    return tryMerge(node);
            }
            // Otherwise, we remove the value from the current node
            else
                removeValue(node, value);
            return false;
        }
    }